

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveInstantiation.cpp
# Opt level: O2

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
 __thiscall
Inferences::PrimitiveInstantiation::ApplicableRewritesFn::operator()
          (ApplicableRewritesFn *this,Literal *l)

{
  uint64_t uVar1;
  TermList term;
  _func_int *p_Var2;
  ulong uVar3;
  TermList TVar4;
  TermList TVar5;
  Literal *in_RDX;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
  VStack_68;
  TermList head;
  TermStack local_58;
  
  uVar3 = (ulong)(*(uint *)&(in_RDX->super_Term).field_0xc & 0xfffffff);
  uVar1 = (in_RDX->super_Term)._args[uVar3 - 1]._content;
  term._content = (in_RDX->super_Term)._args[uVar3]._content;
  TVar4 = Kernel::SortHelper::getEqualityArgumentSort(in_RDX);
  TVar5 = Kernel::SortHelper::getEqualityArgumentSort(in_RDX);
  local_58._cursor = (TermList *)0x0;
  local_58._end = (TermList *)0x0;
  local_58._capacity = 0;
  local_58._stack = (TermList *)0x0;
  head._content = 2;
  ApplicativeHelper::getHeadAndArgs(term,&head,&local_58);
  if ((head._content & 1) == 0) {
    TVar4 = TVar5;
    term._content = uVar1;
  }
  p_Var2 = (l->super_Term)._vptr_Term[5];
  (**(code **)(*(long *)p_Var2 + 0x18))(&VStack_68,p_Var2,term._content,TVar4._content,1);
  Lib::
  pvi<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermWithoutValue>>>
            ((Lib *)this,&VStack_68);
  Lib::
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
  ::~VirtualIterator(&VStack_68);
  Lib::Stack<Kernel::TermList>::~Stack(&local_58);
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
            *)this;
}

Assistant:

VirtualIterator<QueryRes<ResultSubstitutionSP, TermWithoutValue>> operator()(Literal* l)
  {
    TermList lhs = *l->nthArgument(0);
    TermList rhs = *l->nthArgument(1);
   
    TypedTermList lhst(lhs, SortHelper::getEqualityArgumentSort(l));
    TypedTermList rhst(rhs, SortHelper::getEqualityArgumentSort(l));

    TermStack args;
    TermList head;

    ApplicativeHelper::getHeadAndArgs(lhs, head, args);
     
    return pvi(_index->getUnifications((head.isVar() ? lhst : rhst)));
  }